

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_compression.cpp
# Opt level: O2

void compress_triangles_lz4(char *filename)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t nr_of_triangles;
  int local_408c;
  uint8_t *b4;
  uint8_t *b3;
  uint8_t *b2;
  uint8_t *b1;
  uint32_t *triangles;
  float *vertices;
  uint32_t nr_of_vertices;
  LZ4_stream_t lz4Stream_body;
  ulong __size;
  
  iVar1 = trico_read_stl(&nr_of_vertices,&vertices,&nr_of_triangles,&triangles,filename);
  TestEq<int,int>(1,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/int_compression.cpp"
                  ,0x52,"void compress_triangles_lz4(const char *)");
  uVar7 = nr_of_triangles * 3;
  __size = (ulong)uVar7;
  b1 = (uint8_t *)malloc(__size);
  b2 = (uint8_t *)malloc(__size);
  b3 = (uint8_t *)malloc(__size);
  b4 = (uint8_t *)malloc(__size);
  trico_transpose_uint32_aos_to_soa(&b1,&b2,&b3,&b4,triangles,uVar7);
  LZ4_initStream(&lz4Stream_body,0x4020);
  uVar7 = nr_of_triangles * 3;
  uVar6 = 0;
  uVar8 = 0;
  if (uVar7 < 0x7e000001) {
    uVar8 = uVar7 + uVar7 / 0xff + 0x10;
  }
  pcVar4 = (char *)operator_new__((ulong)uVar8);
  iVar1 = LZ4_compress_default((char *)b1,pcVar4,uVar7,uVar8);
  poVar5 = std::operator<<((ostream *)&std::cout,"Compression ratio lz4 for b1: ");
  local_408c = iVar1;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,((float)nr_of_triangles * 3.0) / (float)iVar1)
  ;
  std::operator<<(poVar5,"\n");
  operator_delete__(pcVar4);
  LZ4_initStream(&lz4Stream_body,0x4020);
  uVar7 = nr_of_triangles * 3;
  if (uVar7 < 0x7e000001) {
    uVar6 = uVar7 + uVar7 / 0xff + 0x10;
  }
  pcVar4 = (char *)operator_new__((ulong)uVar6);
  iVar1 = LZ4_compress_default((char *)b2,pcVar4,uVar7,uVar6);
  poVar5 = std::operator<<((ostream *)&std::cout,"Compression ratio lz4 for b2: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,((float)nr_of_triangles * 3.0) / (float)iVar1)
  ;
  std::operator<<(poVar5,"\n");
  operator_delete__(pcVar4);
  LZ4_initStream(&lz4Stream_body,0x4020);
  uVar7 = nr_of_triangles * 3;
  uVar8 = 0;
  uVar6 = 0;
  if (uVar7 < 0x7e000001) {
    uVar6 = uVar7 + uVar7 / 0xff + 0x10;
  }
  pcVar4 = (char *)operator_new__((ulong)uVar6);
  iVar2 = LZ4_compress_default((char *)b3,pcVar4,uVar7,uVar6);
  poVar5 = std::operator<<((ostream *)&std::cout,"Compression ratio lz4 for b3: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,((float)nr_of_triangles * 3.0) / (float)iVar2)
  ;
  std::operator<<(poVar5,"\n");
  operator_delete__(pcVar4);
  LZ4_initStream(&lz4Stream_body,0x4020);
  uVar7 = nr_of_triangles * 3;
  if (uVar7 < 0x7e000001) {
    uVar8 = uVar7 + uVar7 / 0xff + 0x10;
  }
  pcVar4 = (char *)operator_new__((ulong)uVar8);
  iVar3 = LZ4_compress_default((char *)b4,pcVar4,uVar7,uVar8);
  poVar5 = std::operator<<((ostream *)&std::cout,"Compression ratio lz4 for b4: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,((float)nr_of_triangles * 3.0) / (float)iVar3)
  ;
  std::operator<<(poVar5,"\n");
  operator_delete__(pcVar4);
  iVar1 = iVar1 + local_408c;
  poVar5 = std::operator<<((ostream *)&std::cout,"Compression ratio lz4 total: ");
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (poVar5,((float)nr_of_triangles * 12.0) / (float)(uint)(iVar2 + iVar3 + iVar1))
  ;
  std::operator<<(poVar5,"\n");
  free(b1);
  free(b2);
  free(b3);
  free(b4);
  free(vertices);
  free(triangles);
  return;
}

Assistant:

void compress_triangles_lz4(const char* filename)
  {
  uint32_t nr_of_vertices;
  float* vertices;
  uint32_t nr_of_triangles;
  uint32_t* triangles;

  TEST_EQ(1, trico_read_stl(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, filename));

  uint8_t* b1 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b2 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b3 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b4 = (uint8_t*)trico_malloc(nr_of_triangles * 3);

  trico_transpose_uint32_aos_to_soa(&b1, &b2, &b3, &b4, triangles, nr_of_triangles * 3);

  uint32_t total_length = 0;
  {
  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  auto estimateLen = LZ4_COMPRESSBOUND(nr_of_triangles * 3);
  uint8_t* compressed_buf = new uint8_t[estimateLen];

  int bytes_written = LZ4_compress_default((const char*)b1, (char*)compressed_buf, (int)nr_of_triangles * 3, (int)estimateLen);
  total_length += bytes_written;
  std::cout << "Compression ratio lz4 for b1: " << ((float)nr_of_triangles * 3) / (float)bytes_written << "\n";

  delete[] compressed_buf;
  }
  {
  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  auto estimateLen = LZ4_COMPRESSBOUND(nr_of_triangles * 3);
  uint8_t* compressed_buf = new uint8_t[estimateLen];

  int bytes_written = LZ4_compress_default((const char*)b2, (char*)compressed_buf, (int)nr_of_triangles * 3, (int)estimateLen);
  total_length += bytes_written;
  std::cout << "Compression ratio lz4 for b2: " << ((float)nr_of_triangles * 3) / (float)bytes_written << "\n";

  delete[] compressed_buf;
  }
  {
  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  auto estimateLen = LZ4_COMPRESSBOUND(nr_of_triangles * 3);
  uint8_t* compressed_buf = new uint8_t[estimateLen];

  int bytes_written = LZ4_compress_default((const char*)b3, (char*)compressed_buf, (int)nr_of_triangles * 3, (int)estimateLen);
  total_length += bytes_written;
  std::cout << "Compression ratio lz4 for b3: " << ((float)nr_of_triangles * 3) / (float)bytes_written << "\n";

  delete[] compressed_buf;
  }
  {
  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  auto estimateLen = LZ4_COMPRESSBOUND(nr_of_triangles * 3);
  uint8_t* compressed_buf = new uint8_t[estimateLen];

  int bytes_written = LZ4_compress_default((const char*)b4, (char*)compressed_buf, (int)nr_of_triangles * 3, (int)estimateLen);
  total_length += bytes_written;
  std::cout << "Compression ratio lz4 for b4: " << ((float)nr_of_triangles * 3) / (float)bytes_written << "\n";

  delete[] compressed_buf;
  }

  std::cout << "Compression ratio lz4 total: " << ((float)nr_of_triangles*12.f) / (float)total_length << "\n";


  trico_free(b1);
  trico_free(b2);
  trico_free(b3);
  trico_free(b4);
  trico_free(vertices);
  trico_free(triangles);
  }